

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O3

ByteString * __thiscall ByteString::operator+=(ByteString *this,uchar byte)

{
  pointer *ppuVar1;
  iterator __position;
  uchar local_9;
  
  __position._M_current =
       (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_9 = byte;
    std::vector<unsigned_char,SecureAllocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,SecureAllocator<unsigned_char>> *)&this->byteString,__position,
               &local_9);
  }
  else {
    *__position._M_current = byte;
    ppuVar1 = &(this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return this;
}

Assistant:

ByteString& ByteString::operator+=(const unsigned char byte)
{
	byteString.push_back(byte);

	return *this;
}